

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFusion
          (RegisterLiveness *this,Loop *l1,Loop *l2,RegionRegisterLiveness *sim_result)

{
  _Hash_node_base *p_Var1;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  __last_00;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  Op OVar5;
  BasicBlock *pBVar6;
  RegionRegisterLiveness *pRVar7;
  const_iterator cVar8;
  reference puVar9;
  reference ppIVar10;
  BasicBlockListTy *pBVar11;
  reference pvVar12;
  CFG *pCVar13;
  size_type sVar14;
  size_type sVar15;
  unsigned_long *puVar16;
  size_type sVar17;
  Loop *in_R9;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar18;
  anon_class_16_2_f9f0633a_for_predicate_ predicate;
  uint32_t local_3dc;
  Instruction *local_3d8;
  Instruction *insn_3;
  iterator __end3_1;
  iterator __begin3_1;
  BasicBlock *__range3_1;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_3b0;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_3a8;
  undefined1 local_3a0 [8];
  LiveSet live_out_1;
  RegionRegisterLiveness *live_inout_info_1;
  BasicBlock *bb_1;
  DebugScope DStack_350;
  uint32_t bb_id_2;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  BasicBlockListTy *__range2_4;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_330;
  undefined1 local_328 [8];
  IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
  live_loop_l2;
  undefined8 local_310;
  undefined8 local_308;
  Loop *local_300;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_2f8;
  undefined1 local_2d8 [8];
  LiveSet l1_latch_live_out;
  RegionRegisterLiveness *l1_latch_live_inout_info;
  Instruction *local_290;
  Instruction *insn_2;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_268;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
  local_248;
  undefined1 local_228 [8];
  LiveSet live_out;
  RegionRegisterLiveness *live_inout_info;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_1d8;
  uint32_t bb_id_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  BasicBlockListTy *__range2_3;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_1b0;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_1a8;
  undefined1 local_1a0 [8];
  Range live_loop;
  uint32_t local_150;
  uint32_t local_14c;
  Instruction *local_148;
  Instruction *insn_1;
  iterator __end2_2;
  iterator __begin2_2;
  LiveSet *__range2_2;
  uint32_t local_114;
  Instruction *local_110;
  Instruction *insn;
  iterator __end2_1;
  iterator __begin2_1;
  LiveSet *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  RegionRegisterLiveness *live_inout;
  _Node_iterator_base<unsigned_int,_false> _Stack_98;
  uint32_t bb_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  RegionRegisterLiveness *l2_header_live_inout;
  RegionRegisterLiveness *l1_header_live_inout;
  RegionRegisterLiveness *sim_result_local;
  Loop *l2_local;
  Loop *l1_local;
  RegisterLiveness *this_local;
  
  RegionRegisterLiveness::Clear(sim_result);
  pBVar6 = Loop::GetHeaderBlock(l1);
  pRVar7 = Get(this,pBVar6);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::operator=(&sim_result->live_in_,&pRVar7->live_in_);
  pBVar6 = Loop::GetHeaderBlock(l2);
  pRVar7 = Get(this,pBVar6);
  cVar8 = std::
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          ::begin(&pRVar7->live_in_);
  exit_blocks._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&pRVar7->live_in_);
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)sim_result,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
             cVar8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
             exit_blocks._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  Loop::GetExitBlocks(l2,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__range2);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  _Stack_98._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffff68), bVar2) {
    puVar9 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    pRVar7 = Get(this,*puVar9);
    cVar8 = std::
            unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
            ::begin(&pRVar7->live_in_);
    seen_insn._M_h._M_single_bucket =
         (__node_base_ptr)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&pRVar7->live_in_);
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&sim_result->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               cVar8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               seen_insn._M_h._M_single_bucket);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2_1);
  __end2_1 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&sim_result->live_out_);
  insn = (Instruction *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&sim_result->live_out_);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn),
        bVar2) {
    ppIVar10 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                         (&__end2_1);
    local_110 = *ppIVar10;
    RegionRegisterLiveness::AddRegisterClass(sim_result,local_110);
    local_114 = Instruction::result_id(local_110);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2_1,&local_114);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_1);
  }
  __end2_2 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&sim_result->live_in_);
  insn_1 = (Instruction *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&sim_result->live_in_);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn_1),
        bVar2) {
    ppIVar10 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                         (&__end2_2);
    local_148 = *ppIVar10;
    local_14c = Instruction::result_id(local_148);
    sVar17 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2_1,&local_14c);
    if (sVar17 != 0) {
      RegionRegisterLiveness::AddRegisterClass(sim_result,local_148);
      local_150 = Instruction::result_id(local_148);
      pVar18 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&__range2_1,&local_150);
      live_loop.end_.predicate_.l2 =
           (Loop *)pVar18.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_2);
  }
  sim_result->used_registers_ = 0;
  local_1a8._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin(&sim_result->live_in_);
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&sim_result->live_in_);
  predicate.l2 = in_R9;
  predicate.l1 = l2;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)local_1a0,(opt *)&local_1a8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_1b0,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)l1,predicate);
  pBVar11 = Loop::GetBlocks(l1);
  __end2_3 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin(pBVar11);
  _Stack_1d8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(pBVar11);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2_3.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xfffffffffffffe28);
    if (!bVar2) {
      pBVar6 = Loop::GetLatchBlock(l1);
      uVar4 = BasicBlock::id(pBVar6);
      l1_latch_live_out._M_h._M_single_bucket = (__node_base_ptr)Get(this,uVar4);
      if ((RegionRegisterLiveness *)l1_latch_live_out._M_h._M_single_bucket ==
          (RegionRegisterLiveness *)0x0) {
        __assert_fail("l1_latch_live_inout_info != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x19f,
                      "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                     );
      }
      std::
      unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
      ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)local_2d8,
                      &((RegionRegisterLiveness *)l1_latch_live_out._M_h._M_single_bucket)->
                       live_out_);
      IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:385:7)>_>
      ::begin(&local_2f8,
              (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>_>
               *)local_1a0);
      IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:385:7)>_>
      ::end((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>
             *)&live_loop_l2.end_,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>_>
             *)local_1a0);
      __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_2f8.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_2f8.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __first_00.predicate_.l1 = local_2f8.predicate_.l1;
      __first_00.predicate_.l2 = local_2f8.predicate_.l2;
      __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_310;
      __last_00.cur_ =
           (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
           (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
           live_loop_l2.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last_00.predicate_.l1 = (Loop *)local_308;
      __last_00.predicate_.l2 = local_300;
      std::
      unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
      ::
      insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
                ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                  *)local_2d8,__first_00,__last_00);
      local_330._M_cur =
           (__node_type *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_2d8);
      __range2_4 = (BasicBlockListTy *)
                   std::
                   unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)local_2d8);
      _local_328 = make_range<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
                             ((_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)
                              &local_330,
                              (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)
                              &__range2_4);
      pBVar11 = Loop::GetBlocks(l2);
      __end2_4 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::begin(pBVar11);
      DStack_350 = (DebugScope)
                   std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end(pBVar11);
      while( true ) {
        bVar2 = std::__detail::operator!=
                          (&__end2_4.super__Node_iterator_base<unsigned_int,_false>,
                           (_Node_iterator_base<unsigned_int,_false> *)&stack0xfffffffffffffcb0);
        if (!bVar2) {
          std::
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)local_2d8);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2_1);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2);
          return;
        }
        pvVar12 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                            (&__end2_4);
        uVar4 = *pvVar12;
        pCVar13 = IRContext::cfg(this->context_);
        CFG::block(pCVar13,uVar4);
        live_out_1._M_h._M_single_bucket = (__node_base_ptr)Get(this,uVar4);
        if ((RegionRegisterLiveness *)live_out_1._M_h._M_single_bucket ==
            (RegionRegisterLiveness *)0x0) break;
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)local_3a0,
                        &((RegionRegisterLiveness *)live_out_1._M_h._M_single_bucket)->live_out_);
        local_3a8._M_cur =
             (__node_type *)
             IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
             ::begin((IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
                      *)local_328);
        local_3b0._M_cur =
             (__node_type *)
             IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
             ::end((IteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>_>
                    *)local_328);
        std::
        unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::insert<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
                  ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)local_3a0,
                   (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)local_3a8._M_cur,
                   (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)local_3b0._M_cur);
        p_Var1 = live_out_1._M_h._M_single_bucket[0xe]._M_nxt;
        sVar14 = std::
                 unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::size((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)local_3a0);
        sVar15 = std::
                 unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::size((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)(live_out_1._M_h._M_single_bucket + 7));
        __range3_1 = (BasicBlock *)((long)p_Var1 + (sVar14 - sVar15));
        puVar16 = std::max<unsigned_long>(&sim_result->used_registers_,(unsigned_long *)&__range3_1)
        ;
        sim_result->used_registers_ = *puVar16;
        BasicBlock::begin((BasicBlock *)&__end3_1);
        BasicBlock::end((BasicBlock *)&insn_3);
        while (bVar2 = utils::operator!=(&__end3_1.super_iterator,
                                         (iterator_template<spvtools::opt::Instruction> *)&insn_3),
              bVar2) {
          local_3d8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                (&__end3_1.super_iterator);
          OVar5 = Instruction::opcode(local_3d8);
          bVar2 = true;
          if (OVar5 != OpPhi) {
            bVar3 = anon_unknown_8::CreatesRegisterUsage(local_3d8);
            bVar2 = true;
            if (bVar3) {
              local_3dc = Instruction::result_id(local_3d8);
              sVar17 = std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&__range2_1,&local_3dc);
              bVar2 = sVar17 != 0;
            }
          }
          if (!bVar2) {
            RegionRegisterLiveness::AddRegisterClass(sim_result,local_3d8);
          }
          InstructionList::iterator::operator++(&__end3_1);
        }
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)local_3a0);
        std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2_4);
      }
      __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                    ,0x1ab,
                    "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
                   );
    }
    pvVar12 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2_3);
    uVar4 = *pvVar12;
    pCVar13 = IRContext::cfg(this->context_);
    CFG::block(pCVar13,uVar4);
    live_out._M_h._M_single_bucket = (__node_base_ptr)Get(this,uVar4);
    if ((RegionRegisterLiveness *)live_out._M_h._M_single_bucket == (RegionRegisterLiveness *)0x0)
    break;
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_228,
                    &((RegionRegisterLiveness *)live_out._M_h._M_single_bucket)->live_out_);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:385:7)>_>
    ::begin(&local_248,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>_>
             *)local_1a0);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:385:7)>_>
    ::end(&local_268,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:385:7)>_>
           *)local_1a0);
    __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_248.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_248.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.predicate_.l1 = local_248.predicate_.l1;
    __first.predicate_.l2 = local_248.predicate_.l2;
    __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_268.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_268.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.predicate_.l1 = local_268.predicate_.l1;
    __last.predicate_.l2 = local_268.predicate_.l2;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFusion(spvtools::opt::Loop_const&,spvtools::opt::Loop_const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)local_228,__first,__last);
    p_Var1 = live_out._M_h._M_single_bucket[0xe]._M_nxt;
    sVar14 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::size((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_228);
    sVar15 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::size((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)(live_out._M_h._M_single_bucket + 7));
    __range3 = (BasicBlock *)((long)p_Var1 + (sVar14 - sVar15));
    puVar16 = std::max<unsigned_long>(&sim_result->used_registers_,(unsigned_long *)&__range3);
    sim_result->used_registers_ = *puVar16;
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&insn_2);
    while (bVar2 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&insn_2),
          bVar2) {
      local_290 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      OVar5 = Instruction::opcode(local_290);
      bVar2 = true;
      if (OVar5 != OpPhi) {
        bVar3 = anon_unknown_8::CreatesRegisterUsage(local_290);
        bVar2 = true;
        if (bVar3) {
          l1_latch_live_inout_info._4_4_ = Instruction::result_id(local_290);
          sVar17 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2_1,(key_type *)((long)&l1_latch_live_inout_info + 4));
          bVar2 = sVar17 != 0;
        }
      }
      if (!bVar2) {
        RegionRegisterLiveness::AddRegisterClass(sim_result,local_290);
      }
      InstructionList::iterator::operator++(&__end3);
    }
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_228);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2_3);
  }
  __assert_fail("live_inout_info != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x18c,
                "void spvtools::opt::RegisterLiveness::SimulateFusion(const Loop &, const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::SimulateFusion(
    const Loop& l1, const Loop& l2, RegionRegisterLiveness* sim_result) const {
  sim_result->Clear();

  // Compute the live-in state:
  //   sim_result.live_in = l1.live_in U l2.live_in
  // This assumes that |l1| does not generated register that is live-out for
  // |l1|.
  const RegionRegisterLiveness* l1_header_live_inout = Get(l1.GetHeaderBlock());
  sim_result->live_in_ = l1_header_live_inout->live_in_;

  const RegionRegisterLiveness* l2_header_live_inout = Get(l2.GetHeaderBlock());
  sim_result->live_in_.insert(l2_header_live_inout->live_in_.begin(),
                              l2_header_live_inout->live_in_.end());

  // The live-out set of the fused loop is the l2 live-out set.
  std::unordered_set<uint32_t> exit_blocks;
  l2.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                 live_inout->live_in_.end());
  }

  // Compute the register usage information.
  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : sim_result->live_out_) {
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : sim_result->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    sim_result->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  sim_result->used_registers_ = 0;

  // The loop fusion is injecting the l1 before the l2, the latch of l1 will be
  // connected to the header of l2.
  // To compute the register usage, we inject the loop live-in (union of l1 and
  // l2 live-in header blocks) into the live in/out of each basic block of
  // l1 to get the peak register usage. We then repeat the operation to for l2
  // basic blocks but in this case we inject the live-out of the latch of l1.
  auto live_loop = MakeFilterIteratorRange(
      sim_result->live_in_.begin(), sim_result->live_in_.end(),
      [&l1, &l2](Instruction* insn) {
        BasicBlock* bb = insn->context()->get_instr_block(insn);
        return insn->HasResultId() &&
               !(insn->opcode() == spv::Op::OpPhi &&
                 (bb == l1.GetHeaderBlock() || bb == l2.GetHeaderBlock()));
      });

  for (uint32_t bb_id : l1.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop.begin(), live_loop.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }

  const RegionRegisterLiveness* l1_latch_live_inout_info =
      Get(l1.GetLatchBlock()->id());
  assert(l1_latch_live_inout_info != nullptr && "Basic block not processed");
  RegionRegisterLiveness::LiveSet l1_latch_live_out =
      l1_latch_live_inout_info->live_out_;
  l1_latch_live_out.insert(live_loop.begin(), live_loop.end());

  auto live_loop_l2 =
      make_range(l1_latch_live_out.begin(), l1_latch_live_out.end());

  for (uint32_t bb_id : l2.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout_info = Get(bb_id);
    assert(live_inout_info != nullptr && "Basic block not processed");
    RegionRegisterLiveness::LiveSet live_out = live_inout_info->live_out_;
    live_out.insert(live_loop_l2.begin(), live_loop_l2.end());
    sim_result->used_registers_ =
        std::max(sim_result->used_registers_,
                 live_inout_info->used_registers_ + live_out.size() -
                     live_inout_info->live_out_.size());

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      sim_result->AddRegisterClass(&insn);
    }
  }
}